

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O0

void __thiscall QBalloonTip::paintEvent(QBalloonTip *this,QPaintEvent *param_2)

{
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar1;
  QPainter painter;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_10,&in_RDI->super_QPaintDevice);
  QVar1 = QWidget::rect(in_RDI);
  QPainter::drawPixmap(QVar1._8_8_,QVar1._0_8_,(QPixmap *)in_RDI);
  QPainter::~QPainter((QPainter *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBalloonTip::paintEvent(QPaintEvent *)
{
    QPainter painter(this);
    painter.drawPixmap(rect(), pixmap);
}